

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

float3 tinyusdz::transform(matrix4d *m,float3 *p)

{
  array<float,_3UL> aVar1;
  float3 fVar2;
  float local_50 [2];
  float local_48;
  float3 local_40;
  undefined1 local_34 [8];
  float3 tx;
  float3 *p_local;
  matrix4d *m_local;
  
  local_34._0_4_ = (undefined4)m->m[3][0];
  local_34._4_4_ = (undefined4)m->m[3][1];
  tx._M_elems[0] = (float)m->m[3][2];
  tx._M_elems._4_8_ = p;
  aVar1 = value::MultV<tinyusdz::value::matrix4d,std::array<float,3ul>,double,float,3ul>(m,p);
  local_48 = aVar1._M_elems[2];
  local_40._M_elems[2] = local_48;
  local_50 = aVar1._M_elems._0_8_;
  local_40._M_elems[0] = local_50[0];
  local_40._M_elems[1] = local_50[1];
  fVar2 = operator+(&local_40,(float3 *)local_34);
  return (float3)fVar2._M_elems;
}

Assistant:

value::float3 transform(const value::matrix4d &m, const value::float3 &p) {
  value::float3 tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  // MatTy, VecTy, VecBaseTy, vecN
  return value::MultV<value::matrix4d, value::float3, double, float, 3>(m, p) + tx;
}